

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::Lock(CWallet *this)

{
  size_t sVar1;
  pointer puVar2;
  pointer puVar3;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  unique_lock<std::recursive_mutex> local_40;
  unique_lock<std::recursive_mutex> local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  sVar1 = (this->mapMasterKeys)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (sVar1 != 0) {
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_30,&this->m_relock_mutex,
               "m_relock_mutex",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0xd9d,false);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_40,&this->cs_wallet,
               "cs_wallet",
               "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
               ,0xd9d,false);
    puVar2 = (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar3 = (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (puVar2 != puVar3) {
      memory_cleanse(puVar2,(long)puVar3 - (long)puVar2);
      puVar2 = (this->vMasterKey).
               super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish != puVar2) {
        (this->vMasterKey).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish = puVar2;
      }
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_30);
    boost::signals2::
    signal<void_(wallet::CWallet_*),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(wallet::CWallet_*)>,_boost::function<void_(const_boost::signals2::connection_&,_wallet::CWallet_*)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyStatusChanged,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return sVar1 != 0;
  }
  __stack_chk_fail();
}

Assistant:

bool CWallet::Lock()
{
    if (!IsCrypted())
        return false;

    {
        LOCK2(m_relock_mutex, cs_wallet);
        if (!vMasterKey.empty()) {
            memory_cleanse(vMasterKey.data(), vMasterKey.size() * sizeof(decltype(vMasterKey)::value_type));
            vMasterKey.clear();
        }
    }

    NotifyStatusChanged(this);
    return true;
}